

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-output.c
# Opt level: O2

void display_area(wchar_t *text,uint8_t *attrs,size_t *line_starts,size_t *line_lengths,
                 size_t n_lines,region area,size_t line_from)

{
  ulong uVar1;
  ulong uVar2;
  wchar_t y;
  
  if ((ulong)(long)area.page_rows < n_lines) {
    n_lines = (long)area.page_rows;
  }
  for (uVar1 = 0; uVar1 != n_lines; uVar1 = uVar1 + 1) {
    y = area.row + (int)uVar1;
    Term_erase(area.col,y,area.width);
    for (uVar2 = 0; uVar2 < line_lengths[uVar1 + line_from]; uVar2 = uVar2 + 1) {
      Term_putch(area.col + (int)uVar2,y,(uint)attrs[uVar2 + line_starts[uVar1 + line_from]],
                 text[line_starts[uVar1 + line_from] + uVar2]);
    }
  }
  return;
}

Assistant:

static void display_area(const wchar_t *text, const uint8_t *attrs,
		size_t *line_starts, size_t *line_lengths,
		size_t n_lines,
		region area, size_t line_from)
{
	size_t i, j;

	n_lines = MIN(n_lines, (size_t) area.page_rows);

	for (i = 0; i < n_lines; i++) {
		Term_erase(area.col, area.row + i, area.width);
		for (j = 0; j < line_lengths[line_from + i]; j++) {
			Term_putch(area.col + j, area.row + i,
					attrs[line_starts[line_from + i] + j],
					text[line_starts[line_from + i] + j]);
		}
	}
}